

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_sighashtype.cpp
# Opt level: O0

void __thiscall
SigHashType_SetFromSigHashFlag_Test::TestBody(SigHashType_SetFromSigHashFlag_Test *this)

{
  bool bVar1;
  char *pcVar2;
  char *in_R9;
  string local_288;
  AssertHelper local_268;
  Message local_260;
  bool local_251;
  undefined1 local_250 [8];
  AssertionResult gtest_ar__5;
  AssertHelper local_220;
  Message local_218;
  bool local_209;
  undefined1 local_208 [8];
  AssertionResult gtest_ar__4;
  Message local_1f0;
  SigHashAlgorithm local_1e8;
  SigHashAlgorithm local_1e4;
  undefined1 local_1e0 [8];
  AssertionResult gtest_ar_2;
  Message local_1c8;
  string local_1c0;
  AssertHelper local_1a0;
  Message local_198;
  bool local_189;
  undefined1 local_188 [8];
  AssertionResult gtest_ar__3;
  AssertHelper local_158;
  Message local_150;
  bool local_141;
  undefined1 local_140 [8];
  AssertionResult gtest_ar__2;
  Message local_128;
  SigHashAlgorithm local_120;
  SigHashAlgorithm local_11c;
  undefined1 local_118 [8];
  AssertionResult gtest_ar_1;
  Message local_100;
  string local_f8;
  AssertHelper local_d8;
  Message local_d0;
  bool local_c1;
  undefined1 local_c0 [8];
  AssertionResult gtest_ar__1;
  AssertHelper local_90;
  Message local_88;
  bool local_79;
  undefined1 local_78 [8];
  AssertionResult gtest_ar_;
  Message local_60;
  SigHashAlgorithm local_58;
  SigHashAlgorithm local_54;
  undefined1 local_50 [8];
  AssertionResult gtest_ar;
  Message local_38 [3];
  undefined1 local_1c [8];
  SigHashType type;
  SigHashType_SetFromSigHashFlag_Test *this_local;
  
  type._4_8_ = this;
  cfd::core::SigHashType::SigHashType((SigHashType *)local_1c);
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      cfd::core::SigHashType::SetFromSigHashFlag((SigHashType *)local_1c,0x82);
    }
  }
  else {
    testing::Message::Message(local_38);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_sighashtype.cpp"
               ,0x1e,
               "Expected: type.SetFromSigHashFlag(0x82) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar.message_,local_38);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar.message_);
    testing::Message::~Message(local_38);
  }
  local_54 = cfd::core::SigHashType::GetSigHashAlgorithm((SigHashType *)local_1c);
  local_58 = kSigHashNone;
  testing::internal::EqHelper<false>::
  Compare<cfd::core::SigHashAlgorithm,cfd::core::SigHashAlgorithm>
            ((EqHelper<false> *)local_50,"type.GetSigHashAlgorithm()",
             "SigHashAlgorithm::kSigHashNone",&local_54,&local_58);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_50);
  if (!bVar1) {
    testing::Message::Message(&local_60);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_50);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_sighashtype.cpp"
               ,0x1f,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_.message_,&local_60);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_.message_);
    testing::Message::~Message(&local_60);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_50);
  local_79 = cfd::core::SigHashType::IsAnyoneCanPay((SigHashType *)local_1c);
  testing::AssertionResult::AssertionResult<bool>((AssertionResult *)local_78,&local_79,(type *)0x0)
  ;
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_78);
  if (!bVar1) {
    testing::Message::Message(&local_88);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__1.message_,(internal *)local_78,
               (AssertionResult *)"type.IsAnyoneCanPay()","false","true",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_90,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_sighashtype.cpp"
               ,0x20,pcVar2);
    testing::internal::AssertHelper::operator=(&local_90,&local_88);
    testing::internal::AssertHelper::~AssertHelper(&local_90);
    std::__cxx11::string::~string((string *)&gtest_ar__1.message_);
    testing::Message::~Message(&local_88);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_78);
  local_c1 = cfd::core::SigHashType::IsForkId((SigHashType *)local_1c);
  local_c1 = !local_c1;
  testing::AssertionResult::AssertionResult<bool>((AssertionResult *)local_c0,&local_c1,(type *)0x0)
  ;
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_c0);
  if (!bVar1) {
    testing::Message::Message(&local_d0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_f8,(internal *)local_c0,(AssertionResult *)"type.IsForkId()","true","false",
               in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_d8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_sighashtype.cpp"
               ,0x21,pcVar2);
    testing::internal::AssertHelper::operator=(&local_d8,&local_d0);
    testing::internal::AssertHelper::~AssertHelper(&local_d8);
    std::__cxx11::string::~string((string *)&local_f8);
    testing::Message::~Message(&local_d0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_c0);
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      cfd::core::SigHashType::SetFromSigHashFlag((SigHashType *)local_1c,'A');
    }
  }
  else {
    testing::Message::Message(&local_100);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_1.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_sighashtype.cpp"
               ,0x23,
               "Expected: type.SetFromSigHashFlag(0x41) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1.message_,&local_100);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1.message_);
    testing::Message::~Message(&local_100);
  }
  local_11c = cfd::core::SigHashType::GetSigHashAlgorithm((SigHashType *)local_1c);
  local_120 = kSigHashAll;
  testing::internal::EqHelper<false>::
  Compare<cfd::core::SigHashAlgorithm,cfd::core::SigHashAlgorithm>
            ((EqHelper<false> *)local_118,"type.GetSigHashAlgorithm()",
             "SigHashAlgorithm::kSigHashAll",&local_11c,&local_120);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_118);
  if (!bVar1) {
    testing::Message::Message(&local_128);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_118);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar__2.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_sighashtype.cpp"
               ,0x24,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar__2.message_,&local_128);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__2.message_);
    testing::Message::~Message(&local_128);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_118);
  local_141 = cfd::core::SigHashType::IsAnyoneCanPay((SigHashType *)local_1c);
  local_141 = !local_141;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_140,&local_141,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_140);
  if (!bVar1) {
    testing::Message::Message(&local_150);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__3.message_,(internal *)local_140,
               (AssertionResult *)"type.IsAnyoneCanPay()","true","false",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_158,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_sighashtype.cpp"
               ,0x25,pcVar2);
    testing::internal::AssertHelper::operator=(&local_158,&local_150);
    testing::internal::AssertHelper::~AssertHelper(&local_158);
    std::__cxx11::string::~string((string *)&gtest_ar__3.message_);
    testing::Message::~Message(&local_150);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_140);
  local_189 = cfd::core::SigHashType::IsForkId((SigHashType *)local_1c);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_188,&local_189,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_188);
  if (!bVar1) {
    testing::Message::Message(&local_198);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_1c0,(internal *)local_188,(AssertionResult *)"type.IsForkId()","false","true",
               in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_1a0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_sighashtype.cpp"
               ,0x26,pcVar2);
    testing::internal::AssertHelper::operator=(&local_1a0,&local_198);
    testing::internal::AssertHelper::~AssertHelper(&local_1a0);
    std::__cxx11::string::~string((string *)&local_1c0);
    testing::Message::~Message(&local_198);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_188);
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      cfd::core::SigHashType::SetFromSigHashFlag((SigHashType *)local_1c,'\x03');
    }
  }
  else {
    testing::Message::Message(&local_1c8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_2.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_sighashtype.cpp"
               ,0x28,
               "Expected: type.SetFromSigHashFlag(0x03) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2.message_,&local_1c8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2.message_);
    testing::Message::~Message(&local_1c8);
  }
  local_1e4 = cfd::core::SigHashType::GetSigHashAlgorithm((SigHashType *)local_1c);
  local_1e8 = kSigHashSingle;
  testing::internal::EqHelper<false>::
  Compare<cfd::core::SigHashAlgorithm,cfd::core::SigHashAlgorithm>
            ((EqHelper<false> *)local_1e0,"type.GetSigHashAlgorithm()",
             "SigHashAlgorithm::kSigHashSingle",&local_1e4,&local_1e8);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1e0);
  if (!bVar1) {
    testing::Message::Message(&local_1f0);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_1e0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar__4.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_sighashtype.cpp"
               ,0x29,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar__4.message_,&local_1f0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__4.message_);
    testing::Message::~Message(&local_1f0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1e0);
  local_209 = cfd::core::SigHashType::IsAnyoneCanPay((SigHashType *)local_1c);
  local_209 = !local_209;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_208,&local_209,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_208);
  if (!bVar1) {
    testing::Message::Message(&local_218);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__5.message_,(internal *)local_208,
               (AssertionResult *)"type.IsAnyoneCanPay()","true","false",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_220,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_sighashtype.cpp"
               ,0x2a,pcVar2);
    testing::internal::AssertHelper::operator=(&local_220,&local_218);
    testing::internal::AssertHelper::~AssertHelper(&local_220);
    std::__cxx11::string::~string((string *)&gtest_ar__5.message_);
    testing::Message::~Message(&local_218);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_208);
  local_251 = cfd::core::SigHashType::IsForkId((SigHashType *)local_1c);
  local_251 = !local_251;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_250,&local_251,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_250);
  if (!bVar1) {
    testing::Message::Message(&local_260);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_288,(internal *)local_250,(AssertionResult *)"type.IsForkId()","true","false",
               in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_268,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_sighashtype.cpp"
               ,0x2b,pcVar2);
    testing::internal::AssertHelper::operator=(&local_268,&local_260);
    testing::internal::AssertHelper::~AssertHelper(&local_268);
    std::__cxx11::string::~string((string *)&local_288);
    testing::Message::~Message(&local_260);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_250);
  return;
}

Assistant:

TEST(SigHashType, SetFromSigHashFlag) {
  SigHashType type;
  EXPECT_NO_THROW(type.SetFromSigHashFlag(0x82));
  EXPECT_EQ(type.GetSigHashAlgorithm(), SigHashAlgorithm::kSigHashNone);
  EXPECT_TRUE(type.IsAnyoneCanPay());
  EXPECT_FALSE(type.IsForkId());

  EXPECT_NO_THROW(type.SetFromSigHashFlag(0x41));
  EXPECT_EQ(type.GetSigHashAlgorithm(), SigHashAlgorithm::kSigHashAll);
  EXPECT_FALSE(type.IsAnyoneCanPay());
  EXPECT_TRUE(type.IsForkId());

  EXPECT_NO_THROW(type.SetFromSigHashFlag(0x03));
  EXPECT_EQ(type.GetSigHashAlgorithm(), SigHashAlgorithm::kSigHashSingle);
  EXPECT_FALSE(type.IsAnyoneCanPay());
  EXPECT_FALSE(type.IsForkId());
}